

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_init(connectdata *conn)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  POP3 *pop3;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pCVar1 = conn->data;
  pvVar2 = (*Curl_ccalloc)(0x18,1);
  (pCVar1->req).protop = pvVar2;
  if (pvVar2 == (void *)0x0) {
    data._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_init(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct POP3 *pop3;

  pop3 = data->req.protop = calloc(sizeof(struct POP3), 1);
  if(!pop3)
    result = CURLE_OUT_OF_MEMORY;

  return result;
}